

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O2

qpTestResult __thiscall
deqp::ShaderIntegerMixPrototypesCase::test(ShaderIntegerMixPrototypesCase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  long lVar6;
  GLint compileSuccess;
  undefined4 local_4a0;
  GLSLVersion local_49c;
  TestLog *local_498;
  char *local_490;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  string code;
  char *strings [1];
  GLchar infoLog [1000];
  long lVar4;
  
  local_498 = ((this->super_ShaderIntegerMixCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  iVar2 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_49c = (this->super_ShaderIntegerMixCase).m_glslVersion;
  if ((this->super_ShaderIntegerMixCase).field_0x7c == '\x01') {
    bVar1 = glu::glslVersionIsES(local_49c);
    local_49c = GLSL_VERSION_330;
    if (bVar1) {
      local_49c = GLSL_VERSION_300_ES;
    }
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_shader_integer_mix");
    if (!bVar1) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    local_490 = "#extension GL_EXT_shader_integer_mix: enable";
  }
  else {
    if ((int)local_49c < 2) {
      return QP_TEST_RESULT_NOT_SUPPORTED;
    }
    local_490 = "";
  }
  local_4a0 = (undefined4)CONCAT71((int7)((ulong)local_490 >> 8),1);
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 0x10) {
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &args._M_t._M_impl.super__Rb_tree_header._M_header;
    args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    glu::getGLSLVersionDeclaration(local_49c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)infoLog,"VERSION_DECL",(allocator<char> *)&code);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args,(key_type *)infoLog);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)infoLog);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)infoLog,"EXTENSION_ENABLE",(allocator<char> *)&code);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args,(key_type *)infoLog);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)infoLog);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)infoLog,"BODY",(allocator<char> *)&code);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args,(key_type *)infoLog);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)infoLog);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)strings,
               "${VERSION_DECL}\n${EXTENSION_ENABLE}\n\nvoid main()\n{\n\tmix(ivec2(1), ivec2(2), bvec2(true));\n\tmix(ivec3(1), ivec3(2), bvec3(true));\n\tmix(ivec4(1), ivec4(2), bvec4(true));\n\tmix(uvec2(1), uvec2(2), bvec2(true));\n\tmix(uvec3(1), uvec3(2), bvec3(true));\n\tmix(uvec4(1), uvec4(2), bvec4(true));\n\tmix(bvec2(1), bvec2(0), bvec2(true));\n\tmix(bvec3(1), bvec3(0), bvec3(true));\n\tmix(bvec4(1), bvec4(0), bvec4(true));\n\t${BODY}\n}\n"
               ,(allocator<char> *)&compileSuccess);
    tcu::StringTemplate::StringTemplate((StringTemplate *)infoLog,(string *)strings);
    tcu::StringTemplate::specialize(&code,(StringTemplate *)infoLog,&args);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)infoLog);
    std::__cxx11::string::~string((string *)strings);
    uVar3 = (**(code **)(lVar4 + 0x3f0))
                      (*(undefined4 *)((long)&test::shader_targets[0].target + lVar6));
    strings[0] = code._M_dataplus._M_p;
    (**(code **)(lVar4 + 0x12b8))(uVar3,1,(string *)strings,0);
    (**(code **)(lVar4 + 0x248))(uVar3);
    compileSuccess = 0;
    (**(code **)(lVar4 + 0xa70))(uVar3,0x8b81,&compileSuccess);
    if (compileSuccess == 0) {
      (**(code **)(lVar4 + 0xa58))(uVar3,1000,0);
      tcu::TestLog::writeKernelSource(local_498,strings[0]);
      tcu::TestLog::writeCompileInfo
                (local_498,"shader",glcts::fixed_sample_locations_values + 1,false,(char *)infoLog);
      local_4a0 = 0;
    }
    (**(code **)(lVar4 + 0x470))(uVar3);
    std::__cxx11::string::~string((string *)&code);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
  }
  return (uint)(~(byte)local_4a0 & 1);
}

Assistant:

virtual qpTestResult test()
	{
		TestLog&			  log  = m_testCtx.getLog();
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;

		static const char source_template[] = "${VERSION_DECL}\n"
											  "${EXTENSION_ENABLE}\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "	mix(ivec2(1), ivec2(2), bvec2(true));\n"
											  "	mix(ivec3(1), ivec3(2), bvec3(true));\n"
											  "	mix(ivec4(1), ivec4(2), bvec4(true));\n"
											  "	mix(uvec2(1), uvec2(2), bvec2(true));\n"
											  "	mix(uvec3(1), uvec3(2), bvec3(true));\n"
											  "	mix(uvec4(1), uvec4(2), bvec4(true));\n"
											  "	mix(bvec2(1), bvec2(0), bvec2(true));\n"
											  "	mix(bvec3(1), bvec3(0), bvec3(true));\n"
											  "	mix(bvec4(1), bvec4(0), bvec4(true));\n"
											  "	${BODY}\n"
											  "}\n";

		static const struct
		{
			GLenum		target;
			const char* body;
		} shader_targets[] = {
			{ GL_VERTEX_SHADER, "gl_Position = vec4(0);" }, { GL_FRAGMENT_SHADER, "" },
		};

		glu::GLSLVersion v;
		const char*		 extension_enable;

		if (use_extension)
		{
			v				 = glslVersionIsES(m_glslVersion) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;
			extension_enable = "#extension GL_EXT_shader_integer_mix: enable";

			if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
				return QP_TEST_RESULT_NOT_SUPPORTED;
		}
		else
		{
			v				 = m_glslVersion;
			extension_enable = "";

			if (m_glslVersion < glu::GLSL_VERSION_310_ES)
				return QP_TEST_RESULT_NOT_SUPPORTED;
		}

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(shader_targets); i++)
		{
			std::map<std::string, std::string> args;

			args["VERSION_DECL"]	 = glu::getGLSLVersionDeclaration(v);
			args["EXTENSION_ENABLE"] = extension_enable;
			args["BODY"]			 = shader_targets[i].body;

			std::string code = tcu::StringTemplate(source_template).specialize(args);

			GLuint		shader	 = gl.createShader(shader_targets[i].target);
			char const* strings[1] = { code.c_str() };
			gl.shaderSource(shader, 1, strings, 0);
			gl.compileShader(shader);

			GLint compileSuccess = 0;
			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compileSuccess);

			if (!compileSuccess)
			{
				GLchar infoLog[1000];

				gl.getShaderInfoLog(shader, sizeof(infoLog), NULL, infoLog);
				log.writeKernelSource(strings[0]);
				log.writeCompileInfo("shader", "", false, infoLog);

				pass = false;
			}

			gl.deleteShader(shader);
		}

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}